

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_async_function_resolve_create(JSContext *ctx,JSAsyncFunctionData *s,JSValue *resolving_funcs)

{
  JSValue v;
  int iVar1;
  JSValueUnion *pJVar2;
  long in_RDX;
  int *in_RSI;
  JSValue JVar3;
  JSObject *p;
  int i;
  JSValueUnion ctx_00;
  undefined4 uVar4;
  JSClassID in_stack_ffffffffffffffcc;
  JSContext *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar5;
  
  iVar5 = 0;
  while( true ) {
    if (1 < iVar5) {
      return 0;
    }
    pJVar2 = (JSValueUnion *)(in_RDX + (long)iVar5 * 0x10);
    JVar3.u._4_4_ = iVar5;
    JVar3.u.int32 = in_stack_ffffffffffffffd8;
    JVar3.tag = in_RDX;
    JVar3 = JS_NewObjectProtoClass(in_stack_ffffffffffffffd0,JVar3,in_stack_ffffffffffffffcc);
    ctx_00 = JVar3.u;
    uVar4 = (undefined4)JVar3.tag;
    in_stack_ffffffffffffffcc = JVar3.tag._4_4_;
    pJVar2->ptr = (void *)ctx_00;
    pJVar2[1] = (JSValueUnion)JVar3.tag;
    iVar1 = JS_IsException(*(JSValue *)(in_RDX + (long)iVar5 * 0x10));
    if (iVar1 != 0) break;
    in_stack_ffffffffffffffd0 = *(JSContext **)(in_RDX + (long)iVar5 * 0x10);
    *in_RSI = *in_RSI + 1;
    *(int **)&in_stack_ffffffffffffffd0->binary_object_count = in_RSI;
    iVar5 = iVar5 + 1;
  }
  if (iVar5 == 1) {
    v.u._4_4_ = in_stack_ffffffffffffffcc;
    v.u.int32 = uVar4;
    v.tag = (int64_t)in_stack_ffffffffffffffd0;
    JS_FreeValue((JSContext *)ctx_00.ptr,v);
  }
  return -1;
}

Assistant:

static int js_async_function_resolve_create(JSContext *ctx,
                                            JSAsyncFunctionData *s,
                                            JSValue *resolving_funcs)
{
    int i;
    JSObject *p;

    for(i = 0; i < 2; i++) {
        resolving_funcs[i] =
            JS_NewObjectProtoClass(ctx, ctx->function_proto,
                                   JS_CLASS_ASYNC_FUNCTION_RESOLVE + i);
        if (JS_IsException(resolving_funcs[i])) {
            if (i == 1)
                JS_FreeValue(ctx, resolving_funcs[0]);
            return -1;
        }
        p = JS_VALUE_GET_OBJ(resolving_funcs[i]);
        s->header.ref_count++;
        p->u.async_function_data = s;
    }
    return 0;
}